

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O3

void __thiscall gmath::PinholeCamera::getProperties(PinholeCamera *this,Properties *prop,int id)

{
  Distortion *pDVar1;
  Camera *pCVar2;
  undefined1 local_48 [32];
  
  pCVar2 = (Camera *)prop;
  Camera::getProperties(&this->super_Camera,prop,id);
  Camera::getCameraKey_abi_cxx11_((string *)local_48,pCVar2,"A",id);
  pCVar2 = (Camera *)local_48._0_8_;
  gutil::Properties::putValue<gmath::SMatrix<double,3,3>>(prop,(char *)local_48._0_8_,&this->A);
  if ((Camera *)local_48._0_8_ != (Camera *)(local_48 + 0x10)) {
    operator_delete((void *)local_48._0_8_);
  }
  Camera::getCameraKey_abi_cxx11_((string *)local_48,pCVar2,"rho",id);
  gutil::Properties::putValue<double>(prop,(char *)local_48._0_8_,&this->rho);
  if ((Camera *)local_48._0_8_ != (Camera *)(local_48 + 0x10)) {
    operator_delete((void *)local_48._0_8_);
  }
  pDVar1 = this->dist;
  if (pDVar1 != (Distortion *)0x0) {
    (*pDVar1->_vptr_Distortion[8])(pDVar1,prop,(ulong)(uint)id);
  }
  return;
}

Assistant:

void PinholeCamera::getProperties(gutil::Properties &prop, int id) const
{
  Camera::getProperties(prop, id);

  prop.putValue(getCameraKey("A", id).c_str(), A);
  prop.putValue(getCameraKey("rho", id).c_str(), rho);

  if (dist != 0)
  {
    dist->getProperties(prop, id);
  }
}